

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_set_iterator.c
# Opt level: O3

int mpt_object_set_iterator(mpt_object *obj,char *prop,mpt_iterator *it)

{
  int iVar1;
  convIter conv;
  mpt_convertable local_10;
  mpt_iterator *local_8;
  
  local_10._vptr = &mpt_object_set_iterator::convIterCtl;
  local_8 = it;
  iVar1 = (*obj->_vptr->set_property)(obj,prop,&local_10);
  return iVar1;
}

Assistant:

extern int mpt_object_set_iterator(MPT_INTERFACE(object) *obj, const char *prop, MPT_INTERFACE(iterator) *it)
{
	static const MPT_INTERFACE_VPTR(convertable) convIterCtl = {
		iteratorConv
	};
	struct convIter conv;
	
	conv._ctl._vptr = &convIterCtl;
	conv.it = it;
	
	return obj->_vptr->set_property(obj, prop, &conv._ctl);
}